

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O1

void __thiscall higan::EventLoopThread::EventLoopThread(EventLoopThread *this,string *name)

{
  pointer pcVar1;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  EventLoop::EventLoop(&this->loop_);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = EventLoop::Loop;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(EventLoop **)((long)local_58._M_unused._0_8_ + 0x10) = &this->loop_;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(higan::EventLoop::*(higan::EventLoop_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(higan::EventLoop::*(higan::EventLoop_*))()>_>
             ::_M_manager;
  Thread::Thread(&this->thread_,&this->name_,(ThreadFunc *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  Thread::Start(&this->thread_);
  return;
}

Assistant:

EventLoopThread::EventLoopThread(const std::string& name):
		name_(name),
		loop_(),
		thread_(name_, std::bind(&EventLoop::Loop, &loop_))
{
	thread_.Start();
}